

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_string.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::InternalDecompressStringFun::GetFunctions(void)

{
  ScalarFunctionSet *in_RDI;
  pointer input_type;
  size_type __dnew;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_190;
  string local_178;
  ScalarFunction local_158;
  
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)0x1c;
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_178._M_dataplus._M_p =
       (pointer)::std::__cxx11::string::_M_create((ulong *)&local_178,(ulong)&local_158);
  local_178.field_2._M_allocated_capacity =
       (size_type)
       local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function;
  builtin_strncpy(local_178._M_dataplus._M_p,"__internal_decompress_string",0x1c);
  local_178._M_string_length =
       (size_type)
       local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function;
  local_178._M_dataplus._M_p
  [(long)local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function] =
       '\0';
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  CMUtils::StringTypes();
  if (local_190.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_190.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    input_type = local_190.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    do {
      CMStringDecompressFun::GetFunction(&local_158,input_type);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_158);
      local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__ScalarFunction_02476950;
      if (local_158.function_info.internal.
          super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_158.function_info.internal.
                   super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_158.function.super__Function_base._M_manager)
                  ((_Any_data *)&local_158.function,(_Any_data *)&local_158.function,
                   __destroy_functor);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
      input_type = input_type + 1;
    } while (input_type !=
             local_190.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_190);
  return in_RDI;
}

Assistant:

ScalarFunctionSet InternalDecompressStringFun::GetFunctions() {
	return GetStringDecompressFunctionSet();
}